

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void output_out_edges(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  out_edge_t peVar1;
  char *pcVar2;
  DLIST_out_edge_t *pDVar3;
  char *pcVar4;
  
  fwrite("  out edges:",0xc,1,(FILE *)gen_ctx->debug_file);
  pDVar3 = &bb->out_edges;
  while( true ) {
    peVar1 = pDVar3->head;
    if (peVar1 == (out_edge_t)0x0) break;
    pcVar2 = "f";
    pcVar4 = "*";
    if (peVar1->fall_through_p == '\0') {
      pcVar2 = "";
    }
    if (peVar1->back_edge_p == '\0') {
      pcVar4 = "";
    }
    fprintf((FILE *)gen_ctx->debug_file," %3lu%s%s",peVar1->dst->index,pcVar2,pcVar4);
    pDVar3 = (DLIST_out_edge_t *)&(peVar1->out_link).next;
  }
  fputc(10,(FILE *)gen_ctx->debug_file);
  return;
}

Assistant:

static void output_out_edges (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e;

  fprintf (debug_file, "  out edges:");
  for (e = DLIST_HEAD (out_edge_t, bb->out_edges); e != NULL; e = DLIST_NEXT (out_edge_t, e)) {
    fprintf (debug_file, " %3lu%s%s", (unsigned long) e->dst->index, e->fall_through_p ? "f" : "",
             e->back_edge_p ? "*" : "");
  }
  fprintf (debug_file, "\n");
}